

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Restaurant.cpp
# Opt level: O2

void __thiscall Restaurant::goBackup(Restaurant *this)

{
  BaseAction *this_00;
  BaseAction *local_18;
  
  this_00 = (BaseAction *)operator_new(0x30);
  BackupRestaurant::BackupRestaurant((BackupRestaurant *)this_00);
  local_18 = this_00;
  std::vector<BaseAction*,std::allocator<BaseAction*>>::emplace_back<BaseAction*>
            ((vector<BaseAction*,std::allocator<BaseAction*>> *)&this->actionsLog,&local_18);
  (**((BaseAction *)&this_00->_vptr_BaseAction)->_vptr_BaseAction)(this_00,this);
  return;
}

Assistant:

void Restaurant::goBackup()
{
    auto * newBackup = new BackupRestaurant();
    actionsLog.push_back(newBackup);
    newBackup->act(*this);
}